

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-spell.c
# Opt level: O2

menu * spell_menu_new(object *obj,_func__Bool_player_ptr_wchar_t *is_valid,_Bool show_description)

{
  int iVar1;
  _Bool _Var2;
  wchar_t n_spells;
  menu *menu;
  int **spells;
  int iVar3;
  region local_40;
  
  menu = menu_new(MN_SKIN_SCROLL,&spell_menu_iter);
  spells = (int **)mem_alloc(0x20);
  iVar1 = Term->wid;
  iVar3 = 0x50;
  if (iVar1 < 0x60) {
    iVar3 = iVar1 + -0xf;
  }
  local_40.width = 0;
  if (0xf < iVar1) {
    local_40.width = iVar3;
  }
  local_40.col = -local_40.width;
  local_40.row = 1;
  n_spells = spell_collect_from_book(player,obj,spells);
  *(wchar_t *)(spells + 1) = n_spells;
  if ((n_spells != L'\0') && (_Var2 = spell_okay_list(player,is_valid,*spells,n_spells), _Var2)) {
    spells[2] = (int *)is_valid;
    *(undefined4 *)((long)spells + 0x1c) = 0xffffffff;
    *(undefined1 *)((long)spells + 0xc) = 0;
    *(_Bool *)(spells + 3) = show_description;
    menu_setpriv(menu,*(int *)(spells + 1),spells);
    menu->header = "Name                             Lv Mana Fail Info";
    menu->flags = 8;
    menu->selections = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
    menu->browse_hook = spell_menu_browser;
    menu->cmd_keys = "?";
    local_40.page_rows = *(int *)(spells + 1) + 1;
    menu_layout(menu,&local_40);
    return menu;
  }
  mem_free(menu);
  mem_free(*spells);
  mem_free(spells);
  return (menu *)0x0;
}

Assistant:

static struct menu *spell_menu_new(const struct object *obj,
		bool (*is_valid)(const struct player *p, int spell_index),
		bool show_description)
{
	struct menu *m = menu_new(MN_SKIN_SCROLL, &spell_menu_iter);
	struct spell_menu_data *d = mem_alloc(sizeof *d);
	size_t width = MAX(0, MIN(Term->wid - 15, 80));

	region loc = { 0 - width, 1, width, -99 };

	/* collect spells from object */
	d->n_spells = spell_collect_from_book(player, obj, &d->spells);
	if (d->n_spells == 0 || !spell_okay_list(player, is_valid, d->spells, d->n_spells)) {
		mem_free(m);
		mem_free(d->spells);
		mem_free(d);
		return NULL;
	}

	/* Copy across private data */
	d->is_valid = is_valid;
	d->selected_spell = -1;
	d->browse = false;
	d->show_description = show_description;

	menu_setpriv(m, d->n_spells, d);

	/* Set flags */
	m->header = "Name                             Lv Mana Fail Info";
	m->flags = MN_CASELESS_TAGS;
	m->selections = all_letters_nohjkl;
	m->browse_hook = spell_menu_browser;
	m->cmd_keys = "?";

	/* Set size */
	loc.page_rows = d->n_spells + 1;
	menu_layout(m, &loc);

	return m;
}